

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

string * cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_(void)

{
  string *in_RDI;
  string local_30;
  
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  cmsys::SystemTools::CollapseFullPath(in_RDI,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

std::string cmSystemTools::GetCurrentWorkingDirectory()
{
  return cmSystemTools::CollapseFullPath(
    cmsys::SystemTools::GetCurrentWorkingDirectory());
}